

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_stat(char *_fname,PHYSFS_Stat *stat)

{
  DirHandle *h;
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  PHYSFS_ErrorCode PVar8;
  size_t sVar9;
  char *dst;
  ulong uVar10;
  undefined8 *puVar11;
  undefined1 *puVar12;
  undefined1 *ptr;
  DirHandle **ppDVar13;
  ulong uVar14;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  char *local_40;
  char *arcfname;
  
  puVar12 = auStack_48;
  if ((_fname == (char *)0x0) || (stat == (PHYSFS_Stat *)0x0)) {
    puVar11 = &uStack_50;
    uStack_50 = 9;
  }
  else {
    uStack_50 = 0x108bef;
    sVar9 = strlen(_fname);
    if (sVar9 + 1 < 0x100) {
      puVar12 = auStack_48 + -(sVar9 + 0x18 & 0xfffffffffffffff0);
      ptr = puVar12;
    }
    else {
      ptr = (undefined1 *)0x0;
    }
    *(undefined8 *)(puVar12 + -8) = 0x108c33;
    dst = (char *)__PHYSFS_initSmallAlloc(ptr,sVar9 + 1);
    if (dst != (char *)0x0) {
      *(undefined4 *)&stat->createtime = 0xffffffff;
      *(undefined4 *)((long)&stat->createtime + 4) = 0xffffffff;
      *(undefined4 *)&stat->accesstime = 0xffffffff;
      *(undefined4 *)((long)&stat->accesstime + 4) = 0xffffffff;
      *(undefined4 *)&stat->filesize = 0xffffffff;
      *(undefined4 *)((long)&stat->filesize + 4) = 0xffffffff;
      *(undefined4 *)&stat->modtime = 0xffffffff;
      *(undefined4 *)((long)&stat->modtime + 4) = 0xffffffff;
      stat->filetype = PHYSFS_FILETYPE_OTHER;
      stat->readonly = 1;
      *(undefined8 *)(puVar12 + -8) = 0x108c65;
      iVar6 = sanitizePlatformIndependentPath(_fname,dst);
      if (iVar6 == 0) {
        iVar6 = 0;
      }
      else if (*dst == '\0') {
        stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
        stat->readonly = (uint)(writeDir == (DirHandle *)0x0);
        *(undefined8 *)(puVar12 + -8) = 1;
        iVar6 = (int)*(undefined8 *)(puVar12 + -8);
      }
      else {
        arcfname = (char *)stat;
        *(undefined8 *)(puVar12 + -8) = 0x108c87;
        __PHYSFS_platformGrabMutex(stateLock);
        uVar14 = 0;
        uVar10 = 0;
        ppDVar13 = &searchPath;
        while ((iVar6 = (int)uVar14, (int)uVar10 == 0 && (h = *ppDVar13, h != (DirHandle *)0x0))) {
          local_40 = dst;
          *(undefined8 *)(puVar12 + -8) = 0x108cb7;
          iVar6 = partOfMountPoint(h,dst);
          if (iVar6 == 0) {
            uVar10 = 0;
            *(undefined8 *)(puVar12 + -8) = 0x108ce5;
            iVar6 = verifyPath(h,&local_40,0);
            pcVar5 = arcfname;
            pcVar4 = local_40;
            if (iVar6 != 0) {
              pvVar1 = h->opaque;
              p_Var2 = h->funcs->stat;
              *(undefined8 *)(puVar12 + -8) = 0x108cfd;
              uVar7 = (*p_Var2)(pvVar1,pcVar4,(PHYSFS_Stat *)pcVar5);
              if (uVar7 == 0) {
                *(undefined8 *)(puVar12 + -8) = 0x108d09;
                PVar8 = currentErrorCode();
                uVar10 = 0;
                uVar14 = 0;
                if (PVar8 == PHYSFS_ERR_NOT_FOUND) goto LAB_00108d1c;
              }
              *(undefined8 *)(puVar12 + -8) = 1;
              uVar10 = *(ulong *)(puVar12 + -8);
              uVar14 = (ulong)uVar7;
            }
          }
          else {
            arcfname[0x20] = '\x01';
            arcfname[0x21] = '\0';
            arcfname[0x22] = '\0';
            arcfname[0x23] = '\0';
            arcfname[0x24] = '\x01';
            arcfname[0x25] = '\0';
            arcfname[0x26] = '\0';
            arcfname[0x27] = '\0';
            *(undefined8 *)(puVar12 + -8) = 1;
            uVar10 = *(ulong *)(puVar12 + -8);
            uVar14 = uVar10 & 0xffffffff;
          }
LAB_00108d1c:
          ppDVar13 = &h->next;
        }
        *(undefined8 *)(puVar12 + -8) = 0x108d38;
        __PHYSFS_platformReleaseMutex(stateLock);
      }
      if (*(long *)(dst + -8) == 0) {
        return iVar6;
      }
      *(undefined8 *)(puVar12 + -8) = 0x108d72;
      (*__PHYSFS_AllocatorHooks.Free)(dst + -8);
      return iVar6;
    }
    puVar11 = (undefined8 *)(puVar12 + -8);
    *(undefined8 *)(puVar12 + -8) = 2;
  }
  uVar3 = *puVar11;
  *puVar11 = 0x108c17;
  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar3);
  return 0;
}

Assistant:

int PHYSFS_stat(const char *_fname, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    /* set some sane defaults... */
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        if (*fname == '\0')
        {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = !writeDir; /* Writeable if we have a writeDir */
            retval = 1;
        } /* if */
        else
        {
            DirHandle *i;
            int exists = 0;
            __PHYSFS_platformGrabMutex(stateLock);
            for (i = searchPath; ((i != NULL) && (!exists)); i = i->next)
            {
                char *arcfname = fname;
                exists = partOfMountPoint(i, arcfname);
                if (exists)
                {
                    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
                    stat->readonly = 1;
                    retval = 1;
                } /* if */
                else if (verifyPath(i, &arcfname, 0))
                {
                    retval = i->funcs->stat(i->opaque, arcfname, stat);
                    if ((retval) || (currentErrorCode() != PHYSFS_ERR_NOT_FOUND))
                        exists = 1;
                } /* else if */
            } /* for */
            __PHYSFS_platformReleaseMutex(stateLock);
        } /* else */
    } /* if */

    __PHYSFS_smallFree(fname);
    return retval;
}